

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

bool __thiscall ON_PolyCurve::SetEndPoint(ON_PolyCurve *this,ON_3dPoint end_point)

{
  ON_Curve *pOVar1;
  undefined1 uVar2;
  long lVar4;
  int iVar3;
  
  lVar4 = (long)(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
  if ((lVar4 < 1) ||
     (pOVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[lVar4 + -1],
     pOVar1 == (ON_Curve *)0x0)) {
    uVar2 = 0;
  }
  else {
    iVar3 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3a])();
    uVar2 = (undefined1)iVar3;
  }
  ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
  return (bool)uVar2;
}

Assistant:

bool ON_PolyCurve::SetEndPoint(ON_3dPoint end_point)
{
  bool rc = false;
  // just do it // if ( !IsClosed() )
  {
    ON_Curve* c = LastSegmentCurve();
    if ( c )
      rc = c->SetEndPoint(end_point);
  }
	DestroyCurveTree();
  return rc;
}